

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall lattice::graph::site_t::~site_t(site_t *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

site_t(int tp) : type(tp), neighbors(0), neighbor_bonds(0) {}